

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4ebdc::IntrusiveListIteratorTest::SetUp(IntrusiveListIteratorTest *this)

{
  int local_1c [3];
  IntrusiveListIteratorTest *local_10;
  IntrusiveListIteratorTest *this_local;
  
  local_10 = this;
  IntrusiveListTest::SetUp(&this->super_IntrusiveListTest);
  local_1c[2] = 1;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int>
            (&this->list_,local_1c + 2);
  local_1c[1] = 2;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int>
            (&this->list_,local_1c + 1);
  local_1c[0] = 3;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int>(&this->list_,local_1c);
  return;
}

Assistant:

virtual void SetUp() {
    IntrusiveListTest::SetUp();

    list_.emplace_back(1);
    list_.emplace_back(2);
    list_.emplace_back(3);
  }